

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.h
# Opt level: O2

bool __thiscall
siamese::GrowingAlignedDataBuffer::GrowZeroPadded
          (GrowingAlignedDataBuffer *this,Allocator *allocator,uint bytes)

{
  uint8_t *puVar1;
  bool bVar2;
  
  if ((this->Data == (uint8_t *)0x0) || (bVar2 = true, this->Bytes < bytes)) {
    puVar1 = pktalloc::Allocator::Reallocate(allocator,this->Data,bytes,CopyExisting);
    this->Data = puVar1;
    bVar2 = puVar1 != (uint8_t *)0x0;
    if (puVar1 == (uint8_t *)0x0) {
      bytes = 0;
    }
    else {
      memset(puVar1 + this->Bytes,0,(ulong)(bytes - this->Bytes));
    }
    this->Bytes = bytes;
  }
  return bVar2;
}

Assistant:

bool GrowZeroPadded(pktalloc::Allocator* allocator, unsigned bytes)
    {
        SIAMESE_DEBUG_ASSERT(allocator && bytes > 0);
        if (!Data || bytes > Bytes)
        {
            Data = allocator->Reallocate(Data, bytes, pktalloc::Realloc::CopyExisting);
            if (!Data)
            {
                Bytes = 0;
                return false;
            }

            memset(Data + Bytes, 0, bytes - Bytes);
            Bytes = bytes;
        }
        return true;
    }